

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool mkvparser::MasteringMetadata::Parse
               (IMkvReader *reader,longlong mm_start,longlong mm_size,MasteringMetadata **mm)

{
  bool bVar1;
  MasteringMetadata *this;
  pointer pMVar2;
  long lVar3;
  float fVar4;
  pointer pMStack_a0;
  bool value_parse_status_2;
  PrimaryChromaticity **chromaticity;
  bool is_x;
  longlong value_parse_status_1;
  double value_1;
  longlong value_parse_status;
  double value;
  longlong status;
  longlong child_size;
  longlong child_id;
  longlong read_pos;
  longlong mm_end;
  unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
  local_38;
  unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
  mm_ptr;
  MasteringMetadata **mm_local;
  longlong mm_size_local;
  longlong mm_start_local;
  IMkvReader *reader_local;
  
  if ((reader == (IMkvReader *)0x0) || (*mm != (MasteringMetadata *)0x0)) {
    reader_local._7_1_ = false;
  }
  else {
    mm_ptr._M_t.
    super___uniq_ptr_impl<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
    ._M_t.
    super__Tuple_impl<0UL,_mkvparser::MasteringMetadata_*,_std::default_delete<mkvparser::MasteringMetadata>_>
    .super__Head_base<0UL,_mkvparser::MasteringMetadata_*,_false>._M_head_impl =
         (__uniq_ptr_data<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>,_true,_true>
          )(__uniq_ptr_data<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>,_true,_true>
            )mm;
    this = (MasteringMetadata *)operator_new(0x28);
    MasteringMetadata(this);
    std::unique_ptr<mkvparser::MasteringMetadata,std::default_delete<mkvparser::MasteringMetadata>>
    ::unique_ptr<std::default_delete<mkvparser::MasteringMetadata>,void>
              ((unique_ptr<mkvparser::MasteringMetadata,std::default_delete<mkvparser::MasteringMetadata>>
                *)&local_38,this);
    pMVar2 = std::
             unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
             ::get(&local_38);
    if (pMVar2 == (pointer)0x0) {
      reader_local._7_1_ = false;
    }
    else {
      read_pos = mm_start + mm_size;
      child_id = mm_start;
      do {
        if (read_pos <= child_id) {
          pMVar2 = std::
                   unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
                   ::release(&local_38);
          *(pointer *)
           mm_ptr._M_t.
           super___uniq_ptr_impl<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
           ._M_t.
           super__Tuple_impl<0UL,_mkvparser::MasteringMetadata_*,_std::default_delete<mkvparser::MasteringMetadata>_>
           .super__Head_base<0UL,_mkvparser::MasteringMetadata_*,_false>._M_head_impl = pMVar2;
          reader_local._7_1_ = true;
          goto LAB_0012c8f1;
        }
        child_size = 0;
        status = 0;
        value = (double)ParseElementHeader(reader,&child_id,read_pos,&child_size,&status);
        if ((long)value < 0) {
          reader_local._7_1_ = false;
          goto LAB_0012c8f1;
        }
        if (child_size == 0x55d9) {
          value_parse_status = 0;
          value_1 = (double)UnserializeFloat(reader,child_id,status,(double *)&value_parse_status);
          if ((((double)value_parse_status < -3.4028234663852886e+38) ||
              (3.4028234663852886e+38 < (double)value_parse_status)) ||
             ((0.0 < (double)value_parse_status &&
              ((double)value_parse_status < 1.1754943508222875e-38)))) {
            reader_local._7_1_ = false;
            goto LAB_0012c8f1;
          }
          fVar4 = (float)(double)value_parse_status;
          pMVar2 = std::
                   unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
                   ::operator->(&local_38);
          pMVar2->luminance_max = fVar4;
          if ((((long)value_1 < 0) ||
              (pMVar2 = std::
                        unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
                        ::operator->(&local_38), pMVar2->luminance_max < 0.0)) ||
             (pMVar2 = std::
                       unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
                       ::operator->(&local_38), 9999.99 < pMVar2->luminance_max)) {
            reader_local._7_1_ = false;
            goto LAB_0012c8f1;
          }
        }
        else if (child_size == 0x55da) {
          value_parse_status_1 = 0;
          lVar3 = UnserializeFloat(reader,child_id,status,(double *)&value_parse_status_1);
          if ((((double)value_parse_status_1 < -3.4028234663852886e+38) ||
              (3.4028234663852886e+38 < (double)value_parse_status_1)) ||
             ((0.0 < (double)value_parse_status_1 &&
              ((double)value_parse_status_1 < 1.1754943508222875e-38)))) {
            reader_local._7_1_ = false;
            goto LAB_0012c8f1;
          }
          fVar4 = (float)(double)value_parse_status_1;
          pMVar2 = std::
                   unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
                   ::operator->(&local_38);
          pMVar2->luminance_min = fVar4;
          if (((lVar3 < 0) ||
              (pMVar2 = std::
                        unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
                        ::operator->(&local_38), pMVar2->luminance_min < 0.0)) ||
             (pMVar2 = std::
                       unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
                       ::operator->(&local_38), 999.9999 < pMVar2->luminance_min)) {
            reader_local._7_1_ = false;
            goto LAB_0012c8f1;
          }
        }
        else {
          switch(child_size) {
          case 0x55d1:
          case 0x55d2:
            chromaticity._7_1_ = child_size == 0x55d1;
            pMStack_a0 = std::
                         unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
                         ::operator->(&local_38);
            break;
          case 0x55d3:
          case 0x55d4:
            chromaticity._7_1_ = child_size == 0x55d3;
            pMStack_a0 = std::
                         unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
                         ::operator->(&local_38);
            pMStack_a0 = (pointer)&pMStack_a0->g;
            break;
          case 0x55d5:
          case 0x55d6:
            chromaticity._7_1_ = child_size == 0x55d5;
            pMStack_a0 = std::
                         unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
                         ::operator->(&local_38);
            pMStack_a0 = (pointer)&pMStack_a0->b;
            break;
          case 0x55d7:
          case 0x55d8:
            chromaticity._7_1_ = child_size == 0x55d7;
            pMStack_a0 = std::
                         unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>
                         ::operator->(&local_38);
            pMStack_a0 = (pointer)&pMStack_a0->white_point;
            break;
          default:
            reader_local._7_1_ = false;
            goto LAB_0012c8f1;
          }
          bVar1 = PrimaryChromaticity::Parse
                            (reader,child_id,status,chromaticity._7_1_,&pMStack_a0->r);
          if (!bVar1) {
            reader_local._7_1_ = false;
            goto LAB_0012c8f1;
          }
        }
        child_id = status + child_id;
      } while (child_id <= read_pos);
      reader_local._7_1_ = false;
    }
LAB_0012c8f1:
    mm_end._0_4_ = 1;
    std::
    unique_ptr<mkvparser::MasteringMetadata,_std::default_delete<mkvparser::MasteringMetadata>_>::
    ~unique_ptr(&local_38);
  }
  return reader_local._7_1_;
}

Assistant:

bool MasteringMetadata::Parse(IMkvReader* reader, long long mm_start,
                              long long mm_size, MasteringMetadata** mm) {
  if (!reader || *mm)
    return false;

  std::unique_ptr<MasteringMetadata> mm_ptr(new MasteringMetadata());
  if (!mm_ptr.get())
    return false;

  const long long mm_end = mm_start + mm_size;
  long long read_pos = mm_start;

  while (read_pos < mm_end) {
    long long child_id = 0;
    long long child_size = 0;

    const long long status =
        ParseElementHeader(reader, read_pos, mm_end, child_id, child_size);
    if (status < 0)
      return false;

    if (child_id == libwebm::kMkvLuminanceMax) {
      double value = 0;
      const long long value_parse_status =
          UnserializeFloat(reader, read_pos, child_size, value);
      if (value < -FLT_MAX || value > FLT_MAX ||
          (value > 0.0 && value < FLT_MIN)) {
        return false;
      }
      mm_ptr->luminance_max = static_cast<float>(value);
      if (value_parse_status < 0 || mm_ptr->luminance_max < 0.0 ||
          mm_ptr->luminance_max > 9999.99) {
        return false;
      }
    } else if (child_id == libwebm::kMkvLuminanceMin) {
      double value = 0;
      const long long value_parse_status =
          UnserializeFloat(reader, read_pos, child_size, value);
      if (value < -FLT_MAX || value > FLT_MAX ||
          (value > 0.0 && value < FLT_MIN)) {
        return false;
      }
      mm_ptr->luminance_min = static_cast<float>(value);
      if (value_parse_status < 0 || mm_ptr->luminance_min < 0.0 ||
          mm_ptr->luminance_min > 999.9999) {
        return false;
      }
    } else {
      bool is_x = false;
      PrimaryChromaticity** chromaticity;
      switch (child_id) {
        case libwebm::kMkvPrimaryRChromaticityX:
        case libwebm::kMkvPrimaryRChromaticityY:
          is_x = child_id == libwebm::kMkvPrimaryRChromaticityX;
          chromaticity = &mm_ptr->r;
          break;
        case libwebm::kMkvPrimaryGChromaticityX:
        case libwebm::kMkvPrimaryGChromaticityY:
          is_x = child_id == libwebm::kMkvPrimaryGChromaticityX;
          chromaticity = &mm_ptr->g;
          break;
        case libwebm::kMkvPrimaryBChromaticityX:
        case libwebm::kMkvPrimaryBChromaticityY:
          is_x = child_id == libwebm::kMkvPrimaryBChromaticityX;
          chromaticity = &mm_ptr->b;
          break;
        case libwebm::kMkvWhitePointChromaticityX:
        case libwebm::kMkvWhitePointChromaticityY:
          is_x = child_id == libwebm::kMkvWhitePointChromaticityX;
          chromaticity = &mm_ptr->white_point;
          break;
        default:
          return false;
      }
      const bool value_parse_status = PrimaryChromaticity::Parse(
          reader, read_pos, child_size, is_x, chromaticity);
      if (!value_parse_status)
        return false;
    }

    read_pos += child_size;
    if (read_pos > mm_end)
      return false;
  }

  *mm = mm_ptr.release();
  return true;
}